

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::EmitLoadConstInt(SQCompiler *this,SQInteger value,SQInteger target)

{
  SQFuncState *this_00;
  SQOpcode _op;
  
  if (target < 0) {
    target = SQFuncState::PushTarget(this->_fs,-1);
  }
  this_00 = this->_fs;
  if (value + 0x7fffffffU < 0xffffffff) {
    _op = _OP_LOADINT;
  }
  else {
    value = SQFuncState::GetNumericConstant(this_00,value);
    _op = _OP_LOAD;
  }
  SQFuncState::AddInstruction(this_00,_op,target,value,0,0);
  return;
}

Assistant:

void EmitLoadConstInt(SQInteger value,SQInteger target)
    {
        if(target < 0) {
            target = _fs->PushTarget();
        }
        if(value <= INT_MAX && value > INT_MIN) { //does it fit in 32 bits?
            _fs->AddInstruction(_OP_LOADINT, target,value);
        }
        else {
            _fs->AddInstruction(_OP_LOAD, target, _fs->GetNumericConstant(value));
        }
    }